

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

CAddr __thiscall cppforth::Forth::setVirtualMemory(Forth *this,string *value,int segmentName)

{
  Cell CVar1;
  reference pvVar2;
  const_iterator __first;
  const_iterator __last;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  size_type sVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *sourceBufferVirtual;
  int segmentName_local;
  string *value_local;
  Forth *this_local;
  
  pvVar2 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(&this->VirtualMemory,(long)segmentName);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pvVar2->segment,0);
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      (value);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     (value);
  __result = std::back_inserter<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                       (&pvVar2->segment);
  std::
  copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_current,__result);
  pvVar2 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(&this->VirtualMemory,(long)segmentName);
  CVar1 = pvVar2->start;
  pvVar2 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(&this->VirtualMemory,(long)segmentName);
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pvVar2->segment);
  pvVar2 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(&this->VirtualMemory,(long)segmentName);
  pvVar2->end = CVar1 + (int)sVar3;
  pvVar2 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(&this->VirtualMemory,(long)segmentName);
  return pvVar2->start;
}

Assistant:

CAddr setVirtualMemory(const std::string &value, int segmentName){
			auto &sourceBufferVirtual = VirtualMemory.at(segmentName).segment;
			sourceBufferVirtual.resize(0);
			std::copy(value.begin(), value.end(), std::back_inserter(sourceBufferVirtual));
			VirtualMemory.at(segmentName).end = VirtualMemory.at(segmentName).start + 
				static_cast<Cell>(VirtualMemory.at(segmentName).segment.size());
			return VirtualMemory.at(segmentName).start ;
		}